

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

Emitter * __thiscall YAML::Emitter::Write(Emitter *this,Binary *binary)

{
  bool bVar1;
  Emitter *in_RSI;
  Emitter *in_RDI;
  _Tag *this_00;
  value in_stack_ffffffffffffff6c;
  Emitter *in_stack_ffffffffffffff70;
  allocator<char> local_81;
  string local_80 [24];
  Binary *in_stack_ffffffffffffff98;
  ostream_wrapper *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  _Tag *in_stack_ffffffffffffffe0;
  
  this_00 = (_Tag *)&local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"binary",(allocator *)this_00);
  SecondaryTag(in_stack_ffffffffffffffa8);
  Write(in_RSI,in_stack_ffffffffffffffe0);
  _Tag::~_Tag(this_00);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  bVar1 = good((Emitter *)0xefa102);
  if (bVar1) {
    PrepareNode(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    Utils::WriteBinary(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    StartedScalar((Emitter *)0xefa191);
  }
  return in_RDI;
}

Assistant:

Emitter& Emitter::Write(const Binary& binary) {
  Write(SecondaryTag("binary"));

  if (!good())
    return *this;

  PrepareNode(EmitterNodeType::Scalar);
  Utils::WriteBinary(m_stream, binary);
  StartedScalar();

  return *this;
}